

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

double wolfe_eval<sparse_parameters>
                 (vw *all,bfgs *b,float *mem,double loss_sum,double previous_loss_sum,
                 double step_size,double importance_weight_sum,int *origin,double *wolfe1,
                 sparse_parameters *weights)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  p_Var4 = (weights->_map)._M_h._M_before_begin._M_nxt;
  if (p_Var4 == (_Hash_node_base *)0x0) {
    dVar5 = 0.0;
    dVar6 = 0.0;
    dVar7 = 0.0;
    dVar8 = 0.0;
  }
  else {
    dVar5 = 0.0;
    dVar6 = 0.0;
    dVar7 = 0.0;
    dVar8 = 0.0;
    do {
      p_Var1 = p_Var4 + 1;
      p_Var2 = p_Var4 + 2;
      p_Var4 = p_Var4->_M_nxt;
      p_Var3 = p_Var2->_M_nxt[1]._M_nxt;
      dVar9 = (double)*(float *)((long)&p_Var2->_M_nxt->_M_nxt + 4);
      dVar10 = (double)SUB84(p_Var3,0);
      dVar7 = dVar7 + dVar9 * dVar9 * (double)(float)((ulong)p_Var3 >> 0x20);
      dVar8 = dVar8 + dVar10 * (double)mem[(long)(*origin % b->mem_stride) +
                                           ((ulong)p_Var1->_M_nxt >>
                                           ((byte)weights->_stride_shift & 0x3f)) *
                                           (long)b->mem_stride];
      dVar5 = dVar5 + dVar9 * dVar9;
      dVar6 = dVar6 + dVar9 * dVar10;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  dVar9 = (loss_sum - previous_loss_sum) / (dVar8 * step_size);
  *wolfe1 = dVar9;
  if (all->quiet == false) {
    fprintf(_stderr,"%-10.5f\t%-10.5f\t%s%-10f\t%-10f\t",
            dVar5 / (importance_weight_sum * importance_weight_sum),dVar7 / importance_weight_sum,
            dVar9,dVar6 / dVar8," ");
  }
  return step_size * 0.5;
}

Assistant:

double wolfe_eval(vw& all, bfgs& b, float* mem, double loss_sum, double previous_loss_sum, double step_size,
    double importance_weight_sum, int& origin, double& wolfe1, T& weights)
{
  double g0_d = 0.;
  double g1_d = 0.;
  double g1_Hg1 = 0.;
  double g1_g1 = 0.;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    g0_d += ((double)mem1[(MEM_GT + origin) % b.mem_stride]) * ((&(*w))[W_DIR]);
    g1_d += ((double)(&(*w))[W_GT]) * (&(*w))[W_DIR];
    g1_Hg1 += ((double)(&(*w))[W_GT]) * (&(*w))[W_GT] * ((&(*w))[W_COND]);
    g1_g1 += ((double)(&(*w))[W_GT]) * (&(*w))[W_GT];
  }

  wolfe1 = (loss_sum - previous_loss_sum) / (step_size * g0_d);
  double wolfe2 = g1_d / g0_d;
  // double new_step_cross = (loss_sum-previous_loss_sum-g1_d*step)/(g0_d-g1_d);

  if (!all.quiet)
    fprintf(stderr, "%-10.5f\t%-10.5f\t%s%-10f\t%-10f\t", g1_g1 / (importance_weight_sum * importance_weight_sum),
        g1_Hg1 / importance_weight_sum, " ", wolfe1, wolfe2);
  return 0.5 * step_size;
}